

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastLut(Gia_Man_t *pNew,word Truth,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int Entry;
  Vec_Int_t *vMemory;
  word Truth_local;
  Gia_Man_t *local_48;
  Vec_Int_t vLeaves;
  
  Truth_local = Truth;
  local_48 = pNew;
  vMemory = Vec_IntAlloc(0);
  vRes->nSize = 0;
  vLeaves.nCap = nFans;
  vLeaves.nSize = nFans;
  vLeaves.pArray = pFans;
  if (nOuts == 1) {
    if (nFans < 6) {
      Truth_local = Abc_Tt6Stretch(Truth,nFans);
    }
    Entry = Kit_TruthToGia(local_48,(uint *)&Truth_local,nFans,vMemory,&vLeaves,1);
    Vec_IntPush(vRes,Entry);
    Vec_IntFree(vMemory);
    return;
  }
  __assert_fail("nOuts == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x2d8,"void Wlc_BlastLut(Gia_Man_t *, word, int *, int, int, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastLut( Gia_Man_t * pNew, word Truth, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    int iLit;
    Vec_IntClear( vRes );
    assert( nOuts == 1 );
    if ( nFans < 6 )
        Truth = Abc_Tt6Stretch( Truth, nFans );
    iLit = Kit_TruthToGia( pNew, (unsigned *)&Truth, nFans, vMemory, &vLeaves, 1 );
    Vec_IntPush( vRes, iLit );
    Vec_IntFree( vMemory );
}